

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.h
# Opt level: O3

size_t __thiscall
embree::FastAllocator::Block::getWastedBytes(Block *this,AllocationType atype,bool huge_pages)

{
  size_t sVar1;
  
  sVar1 = 0;
  do {
    if (atype == ANY_TYPE) {
LAB_00b7b6bf:
      sVar1 = sVar1 + this->wasted + 0x40;
    }
    else if (this->atype == EMBREE_OS_MALLOC) {
      if ((atype == EMBREE_OS_MALLOC) && (this->huge_pages == huge_pages)) goto LAB_00b7b6bf;
    }
    else if (this->atype == atype) goto LAB_00b7b6bf;
    this = this->next;
    if (this == (Block *)0x0) {
      return sVar1;
    }
  } while( true );
}

Assistant:

size_t getWastedBytes(AllocationType atype, bool huge_pages = false) const {
        size_t bytes = 0;
        for (const Block* block = this; block; block = block->next) {
          if (!block->hasType(atype,huge_pages)) continue;
          bytes += block->getBlockWastedBytes();
        }
        return bytes;
      }